

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_coords.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ChStreamOutAscii *pCVar31;
  int iVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ChTimer<double> timer;
  ChFrameMoving<double> mframemovingB1;
  ChCoordsys<double> c_0;
  ChFrameMoving<double> mresg;
  ChFrame<double> f32;
  ChFrame<double> f10;
  ChFrame<double> f21;
  ChMatrix33<double> mrotA;
  ChFrame<double> f_0;
  ChFrame<double> mframeA;
  ChFrameMoving<double> testPw;
  ChFrame<double> f_3;
  ChFrameMoving<double> testX;
  ChFrame<double> mframeAinv;
  ChFrameMoving<double> bres;
  ChFrame<double> tempf;
  ChMatrix33<double> m32;
  ChMatrix33<double> m21;
  ChMatrix33<double> m10;
  ChFrame<double> mresf;
  ChVector<double> local_fd8;
  ChVector<double> local_fb8;
  ChVector<double> local_f98;
  ChTimer<double> local_f78;
  ChVector<double> local_f58;
  ChFrameMoving<double> local_f38;
  ChQuaternion<double> local_e38;
  ChVector<double> local_e18;
  ChFrameMoving<double> local_df8;
  ChCoordsys<double> local_cf8;
  undefined1 local_cb8 [16];
  double local_ca8;
  ChVector<double> local_bb8;
  ChVector<double> local_b98;
  ChFrameMoving<double> local_b78;
  ChFrame<double> local_a78;
  ChFrame<double> local_9f0;
  ChFrame<double> local_968;
  ChFrame<double> local_8e0;
  ChQuaternion<double> local_858;
  ChQuaternion<double> local_838;
  ChMatrix33<double> local_818;
  ChFrame<double> local_7c8;
  ChFrame<double> local_740;
  ChVector<double> local_6b8;
  ChVector<double> local_698;
  ChFrameMoving<double> local_678;
  ChCoordsys<double> local_578;
  ChQuaternion<double> local_540;
  ChFrame<double> local_520;
  ChFrameMoving<double> local_498;
  ChFrame<double> local_3a0;
  ChFrameMoving<double> local_318;
  ChFrame<double> local_218;
  ChMatrix33<double> local_190;
  ChMatrix33<double> local_148;
  ChMatrix33<double> local_100;
  ChFrame<double> local_b8;
  
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = (ChStreamOutAscii *)
            chrono::ChStreamOutAscii::operator<<
                      (pCVar31,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar31 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar31,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar31,"\n\n");
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar31,"CHRONO demo about coordinate transformations: \n\n")
  ;
  local_f58.m_data[2] = 0.0;
  local_f58.m_data[0] = 0.0;
  local_f58.m_data[1] = 0.0;
  local_fd8.m_data[0] = 2.0;
  local_fd8.m_data[1] = 3.0;
  local_fd8.m_data[2] = 4.0;
  local_f98.m_data[0] = 5.0;
  local_f98.m_data[1] = 6.0;
  local_f98.m_data[2] = 7.0;
  local_e38.m_data[0] = 1.0;
  local_e38.m_data[1] = 3.0;
  local_e38.m_data[2] = 4.0;
  local_e38.m_data[3] = 5.0;
  chrono::ChQuaternion<double>::Normalize(&local_e38);
  chrono::ChMatrix33<double>::Set_A_quaternion(&local_818,&local_e38);
  auVar29._8_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar29._0_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar30._8_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar30._0_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar35 = vmovhpd_avx(auVar29,local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[4]);
  auVar21._8_8_ = 0x4008000000000000;
  auVar21._0_8_ = 0x4008000000000000;
  auVar34 = vmulpd_avx512vl(auVar35,auVar21);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 3.0;
  auVar20 = vfmadd231sd_fma(auVar52,auVar48,ZEXT816(0x4000000000000000));
  local_578.pos.m_data[0] = 5.0;
  local_578.pos.m_data[1] = 6.0;
  local_578.pos.m_data[2] = 7.0;
  local_578.rot.m_data[0] = local_e38.m_data[0];
  local_578.rot.m_data[1] = local_e38.m_data[1];
  local_578.rot.m_data[2] = local_e38.m_data[2];
  local_578.rot.m_data[3] = local_e38.m_data[3];
  auVar28._8_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar28._0_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar20 = vfmadd231sd_fma(auVar20,ZEXT816(0x4010000000000000),auVar35);
  auVar35 = vmovhpd_avx(auVar28,local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[3]);
  auVar22._8_8_ = 0x4000000000000000;
  auVar22._0_8_ = 0x4000000000000000;
  auVar34 = vfmadd132pd_avx512vl(auVar35,auVar34,auVar22);
  auVar35 = vmovhpd_avx(auVar30,local_818.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[5]);
  local_fb8.m_data[2] = auVar20._0_8_ + 7.0;
  auVar23._8_8_ = 0x4010000000000000;
  auVar23._0_8_ = 0x4010000000000000;
  auVar35 = vfmadd132pd_avx512vl(auVar35,auVar34,auVar23);
  local_fb8.m_data[0] = auVar35._0_8_ + 5.0;
  local_fb8.m_data[1] = auVar35._8_8_ + 6.0;
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using linear algebra, \n");
  chrono::ChQuaternion<double>::Rotate(&local_e38,&local_fd8);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame + 5.0;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0] + 6.0;
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1] + 7.0;
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using quaternion rotation, \n");
  chrono::ChTransform<double>::TransformLocalToParent(&local_fd8,&local_f98,&local_818);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using the ChTransform- vect and rot.matrix, \n");
  chrono::ChTransform<double>::TransformLocalToParent(&local_fd8,&local_f98,&local_e38);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChVector<double> *)&local_f38,&local_578,&local_fd8);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using a ChChCoordsys<> object, \n");
  chrono::ChCoordsys<double>::TransformPointLocalToParent
            ((ChVector<double> *)&local_f38,&local_578,&local_fd8);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using a ChChCoordsys<> \'>>\' operator, \n");
  chrono::ChCoordsys<double>::TransformPointLocalToParent
            ((ChVector<double> *)&local_f38,&local_578,&local_fd8);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using a ChChCoordsys<> \'*\' operator, \n");
  chrono::ChFrame<double>::ChFrame(&local_740,&local_f98,&local_e38);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_f38,&local_740,&local_fd8);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using a ChFrame object function, \n");
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_f38,&local_740,&local_fd8);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using a ChFrame \'>>\' operator, \n");
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_f38,&local_740,&local_fd8);
  local_fb8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fb8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fb8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fb8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..using a ChFrame \'*\' operator, \n");
  local_698.m_data[0] = 5.0;
  local_698.m_data[1] = 6.0;
  local_698.m_data[2] = 7.0;
  local_838.m_data[0] = 1.0;
  local_838.m_data[1] = 3.0;
  local_838.m_data[2] = 4.0;
  local_838.m_data[3] = 5.0;
  chrono::ChQuaternion<double>::Normalize(&local_838);
  chrono::ChMatrix33<double>::Set_A_quaternion(&local_100,&local_838);
  local_b98.m_data[0] = 4.0;
  local_b98.m_data[1] = 1.0;
  local_b98.m_data[2] = 3.0;
  local_858.m_data[0] = 3.0;
  local_858.m_data[1] = 2.0;
  local_858.m_data[2] = 1.0;
  local_858.m_data[3] = 5.0;
  chrono::ChQuaternion<double>::Normalize(&local_858);
  chrono::ChMatrix33<double>::Set_A_quaternion(&local_148,&local_858);
  local_bb8.m_data[0] = 1.0;
  local_bb8.m_data[1] = 5.0;
  local_bb8.m_data[2] = 1.0;
  local_540.m_data[0] = 4.0;
  local_540.m_data[1] = 1.0;
  local_540.m_data[2] = 3.0;
  local_540.m_data[3] = 1.0;
  chrono::ChQuaternion<double>::Normalize(&local_540);
  chrono::ChMatrix33<double>::Set_A_quaternion(&local_190,&local_540);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_fd8.m_data[0];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_fd8.m_data[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_fd8.m_data[1] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar35 = vfmadd231sd_fma(auVar43,auVar36,auVar20);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       local_fd8.m_data[1] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar20 = vfmadd231sd_fma(auVar53,auVar36,auVar34);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_fd8.m_data[1] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar34 = vfmadd231sd_fma(auVar38,auVar36,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar35 = vfmadd231sd_fma(auVar35,auVar49,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar20 = vfmadd231sd_fma(auVar20,auVar49,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar34 = vfmadd231sd_fma(auVar34,auVar49,auVar4);
  dVar17 = auVar20._0_8_ + 5.0;
  dVar18 = auVar35._0_8_ + 1.0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar18;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       dVar17 * local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar35 = vfmadd231sd_fma(auVar56,auVar44,auVar5);
  dVar19 = auVar34._0_8_ + 1.0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       dVar17 * local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar20 = vfmadd231sd_fma(auVar54,auVar44,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar18;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       dVar17 * local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar34 = vfmadd231sd_fma(auVar50,auVar45,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar19;
  auVar35 = vfmadd231sd_fma(auVar35,auVar39,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar34 = vfmadd231sd_fma(auVar34,auVar39,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar19;
  auVar20 = vfmadd231sd_fma(auVar20,auVar40,auVar10);
  dVar17 = auVar20._0_8_ + 4.0;
  dVar18 = auVar34._0_8_ + 3.0;
  dVar19 = auVar35._0_8_ + 1.0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar17;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar19 * local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar35 = vfmadd231sd_fma(auVar51,auVar41,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       dVar19 * local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar20 = vfmadd231sd_fma(auVar55,auVar41,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       dVar19 * local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar17;
  auVar34 = vfmadd231sd_fma(auVar37,auVar42,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar18;
  auVar34 = vfmadd231sd_fma(auVar34,auVar46,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar35 = vfmadd231sd_fma(auVar35,auVar46,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar18;
  auVar20 = vfmadd231sd_fma(auVar20,auVar47,auVar16);
  local_f58.m_data[0] = auVar35._0_8_ + local_698.m_data[0];
  local_f58.m_data[1] = auVar20._0_8_ + local_698.m_data[1];
  local_f58.m_data[2] = auVar34._0_8_ + local_698.m_data[2];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_f58);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..triple trsf. using linear algebra, \n");
  chrono::ChFrame<double>::ChFrame(&local_9f0,&local_698,&local_838);
  chrono::ChFrame<double>::ChFrame(&local_8e0,&local_b98,&local_858);
  chrono::ChFrame<double>::ChFrame(&local_a78,&local_bb8,&local_540);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_df8,&local_a78,&local_fd8);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)local_cb8,&local_8e0,(ChVector<double> *)&local_df8);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_f38,&local_9f0,(ChVector<double> *)local_cb8);
  local_f58.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_f58.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_f58.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_f58);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..triple vector trsf. with ChFrame \'>>\' operator, \n");
  chrono::ChFrame<double>::operator*((ChFrame<double> *)local_cb8,&local_9f0,&local_8e0);
  chrono::ChFrame<double>::operator*
            (&local_f38.super_ChFrame<double>,(ChFrame<double> *)local_cb8,&local_a78);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_df8,&local_f38.super_ChFrame<double>,&local_fd8);
  local_f58.m_data[0] = (double)local_df8.super_ChFrame<double>._vptr_ChFrame;
  local_f58.m_data[1] = local_df8.super_ChFrame<double>.coord.pos.m_data[0];
  local_f58.m_data[2] = local_df8.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_f58);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_f38.super_ChFrame<double>,&local_9f0,&local_8e0);
  chrono::ChFrame<double>::operator*(&local_218,&local_f38.super_ChFrame<double>,&local_a78);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_f38,&local_218,&local_fd8);
  local_f58.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_f58.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_f58.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_f58);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  local_f38.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_f38.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_f38.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_f38.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  chrono::ChFrame<double>::ChFrame(&local_520,&local_fd8,(ChQuaternion<double> *)&local_f38);
  local_f38.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_ca8 = 0.0;
  local_f38.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_cb8 = ZEXT816(0);
  local_f38.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_f38.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  chrono::ChFrame<double>::ChFrame
            (&local_7c8,(ChVector<double> *)local_cb8,(ChQuaternion<double> *)&local_f38);
  chrono::ChFrame<double>::operator>>(&local_df8.super_ChFrame<double>,&local_520,&local_a78);
  chrono::ChFrame<double>::operator>>
            ((ChFrame<double> *)local_cb8,&local_df8.super_ChFrame<double>,&local_8e0);
  chrono::ChFrame<double>::operator>>
            (&local_f38.super_ChFrame<double>,(ChFrame<double> *)local_cb8,&local_9f0);
  chrono::ChFrame<double>::operator=(&local_7c8,&local_f38.super_ChFrame<double>);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_7c8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..triple frame trsf. with ChFrame \'>>\' operator,  \n");
  chrono::ChFrame<double>::operator*(&local_df8.super_ChFrame<double>,&local_9f0,&local_8e0);
  chrono::ChFrame<double>::operator*
            ((ChFrame<double> *)local_cb8,&local_df8.super_ChFrame<double>,&local_a78);
  chrono::ChFrame<double>::operator*
            (&local_f38.super_ChFrame<double>,(ChFrame<double> *)local_cb8,&local_520);
  chrono::ChFrame<double>::operator=(&local_7c8,&local_f38.super_ChFrame<double>);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_7c8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..triple frame trsf. with ChFrame \'*\' operator,  \n");
  local_cf8.pos.m_data[2] = 0.0;
  local_cf8.pos.m_data[0] = 0.0;
  local_cf8.pos.m_data[1] = 0.0;
  local_cf8.rot.m_data[0] = 1.0;
  local_cf8.rot.m_data[3] = 0.0;
  local_cf8.rot.m_data[1] = 0.0;
  local_cf8.rot.m_data[2] = 0.0;
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_df8,&local_a78.coord,&local_520.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)local_cb8,&local_8e0.coord,(ChCoordsys<double> *)&local_df8);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_f38,&local_9f0.coord,(ChCoordsys<double> *)local_cb8);
  chrono::ChCoordsys<double>::operator=(&local_cf8,(ChCoordsys<double> *)&local_f38);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_7c8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..triple frame trsf. with ChCoordsys \'>>\' operator,  \n");
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_df8,&local_9f0.coord,&local_8e0.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)local_cb8,(ChCoordsys<double> *)&local_df8,&local_a78.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_f38,(ChCoordsys<double> *)local_cb8,&local_520.coord);
  chrono::ChCoordsys<double>::operator=(&local_cf8,(ChCoordsys<double> *)&local_f38);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_7c8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..triple frame trsf. with ChCoordsys \'*\' operator,  \n");
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..mvect1 \n");
  auVar24._8_8_ = local_fb8.m_data[1];
  auVar24._0_8_ = local_fb8.m_data[0];
  local_df8.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&local_818;
  auVar26._8_8_ = local_f98.m_data[1];
  auVar26._0_8_ = local_f98.m_data[0];
  local_cb8 = vsubpd_avx(auVar24,auVar26);
  local_ca8 = local_fb8.m_data[2] - local_f98.m_data[2];
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_df8,
                    (ChVector<double> *)local_cb8);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv, using linear algebra, \n");
  auVar25._8_8_ = local_fb8.m_data[1];
  auVar25._0_8_ = local_fb8.m_data[0];
  auVar27._8_8_ = local_f98.m_data[1];
  auVar27._0_8_ = local_f98.m_data[0];
  local_cb8 = vsubpd_avx(auVar25,auVar27);
  local_ca8 = local_fb8.m_data[2] - local_f98.m_data[2];
  chrono::ChQuaternion<double>::RotateBack(&local_e38,(ChVector<double> *)local_cb8);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv, using quaternion rotation, \n");
  chrono::ChTransform<double>::TransformParentToLocal(&local_fb8,&local_f98,&local_818);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..inv, using the ChTransform- vect and rot.matrix, \n");
  chrono::ChTransform<double>::TransformParentToLocal(&local_fb8,&local_f98,&local_e38);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv, using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformParentToLocal
            ((ChVector<double> *)&local_f38,&local_578,&local_fb8);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv, using a ChChCoordsys<> object, \n");
  chrono::ChFrame<double>::TransformParentToLocal
            ((ChVector<double> *)&local_f38,&local_740,&local_fb8);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv, using a ChFrame object function, \n");
  chrono::ChFrame<double>::GetInverse(&local_f38.super_ChFrame<double>,&local_740);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)local_cb8,&local_f38.super_ChFrame<double>,&local_fb8);
  local_fd8.m_data[0] = (double)local_cb8._0_8_;
  local_fd8.m_data[1] = (double)local_cb8._8_8_;
  local_fd8.m_data[2] = local_ca8;
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..inv, using a ChFrame inverse and \'>>\' operator, \n");
  chrono::ChFrame<double>::GetInverse(&local_f38.super_ChFrame<double>,&local_740);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)local_cb8,&local_f38.super_ChFrame<double>,&local_fb8);
  local_fd8.m_data[0] = (double)local_cb8._0_8_;
  local_fd8.m_data[1] = (double)local_cb8._8_8_;
  local_fd8.m_data[2] = local_ca8;
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar31," ..inv, using a ChFrame inverse and  \'*\' operator, \n");
  chrono::ChFrame<double>::TransformParentToLocal
            ((ChVector<double> *)&local_f38,&local_740,&local_fb8);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv, using a ChFrame \'/\' operator, \n");
  chrono::ChFrame<double>::ChFrame(&local_3a0,&local_740);
  chrono::ChFrame<double>::Invert(&local_3a0);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_f38,&local_3a0,&local_fb8);
  local_fd8.m_data[0] = (double)local_f38.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_f38.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_f38.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv, using an inverted ChFrame \n");
  chrono::ChFrame<double>::operator*(&local_df8.super_ChFrame<double>,&local_9f0,&local_8e0);
  chrono::ChFrame<double>::operator*
            ((ChFrame<double> *)local_cb8,&local_df8.super_ChFrame<double>,&local_a78);
  chrono::ChFrame<double>::GetInverse(&local_f38.super_ChFrame<double>,(ChFrame<double> *)local_cb8)
  ;
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_b78,&local_f38.super_ChFrame<double>,&local_f58);
  local_fd8.m_data[0] = (double)local_b78.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_b78.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_b78.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv three transf \n");
  chrono::ChFrame<double>::GetInverse(&local_df8.super_ChFrame<double>,&local_a78);
  chrono::ChFrame<double>::GetInverse(&local_b78.super_ChFrame<double>,&local_8e0);
  chrono::ChFrame<double>::operator*
            ((ChFrame<double> *)local_cb8,&local_df8.super_ChFrame<double>,
             &local_b78.super_ChFrame<double>);
  chrono::ChFrame<double>::GetInverse(&local_678.super_ChFrame<double>,&local_9f0);
  chrono::ChFrame<double>::operator*
            (&local_f38.super_ChFrame<double>,(ChFrame<double> *)local_cb8,
             &local_678.super_ChFrame<double>);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_498,&local_f38.super_ChFrame<double>,&local_f58);
  local_fd8.m_data[0] = (double)local_498.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_498.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_498.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::operator>>(&local_df8.super_ChFrame<double>,&local_a78,&local_8e0);
  chrono::ChFrame<double>::operator>>
            ((ChFrame<double> *)local_cb8,&local_df8.super_ChFrame<double>,&local_9f0);
  chrono::ChFrame<double>::GetInverse(&local_f38.super_ChFrame<double>,(ChFrame<double> *)local_cb8)
  ;
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_b78,&local_f38.super_ChFrame<double>,&local_f58);
  local_fd8.m_data[0] = (double)local_b78.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_b78.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_b78.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::GetInverse(&local_f38.super_ChFrame<double>,&local_9f0);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_498,&local_f38.super_ChFrame<double>,&local_f58);
  chrono::ChFrame<double>::GetInverse((ChFrame<double> *)local_cb8,&local_8e0);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_678,(ChFrame<double> *)local_cb8,
             (ChVector<double> *)&local_498);
  chrono::ChFrame<double>::GetInverse(&local_df8.super_ChFrame<double>,&local_a78);
  chrono::ChFrame<double>::TransformLocalToParent
            ((ChVector<double> *)&local_b78,&local_df8.super_ChFrame<double>,
             (ChVector<double> *)&local_678);
  local_fd8.m_data[0] = (double)local_b78.super_ChFrame<double>._vptr_ChFrame;
  local_fd8.m_data[1] = local_b78.super_ChFrame<double>.coord.pos.m_data[0];
  local_fd8.m_data[2] = local_b78.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_fd8);
  chrono::ChStreamOutAscii::operator<<(pCVar31," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::ChFrame(&local_968,&local_f98,&local_e38);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_f38,&local_f98,&local_e38);
  chrono::operator*(&local_b8,&local_f38,&local_968);
  chrono::operator*((ChFrameMoving<double> *)local_cb8,&local_968,&local_f38);
  chrono::ChFrame<double>::ConcatenatePreTransformation(&local_968,&local_9f0);
  local_968.coord.pos.m_data[0] = local_968.coord.pos.m_data[0] + 1.0;
  local_968.coord.pos.m_data[1] = local_968.coord.pos.m_data[1] + 2.0;
  local_968.coord.pos.m_data[2] = local_968.coord.pos.m_data[2] + 3.0;
  chrono::Q_from_AngAxis(0.5235987755982988,(ChVector *)&local_df8);
  chrono::ChFrame<double>::operator>>=(&local_968,(ChQuaternion<double> *)&local_df8);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar31," %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n");
  chrono::ChMatrix33<double>::Set_A_quaternion(&local_818,&local_e38);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_df8,&local_f98,&local_e38);
  local_df8.coord_dt.pos.m_data[0] = 0.5;
  local_df8.coord_dt.pos.m_data[1] = 0.6;
  local_df8.coord_dt.pos.m_data[2] = 0.7;
  local_b78.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff199999999999a;
  local_b78.super_ChFrame<double>.coord.pos.m_data[0] = 2.1;
  local_b78.super_ChFrame<double>.coord.pos.m_data[1] = 5.1;
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_df8,(ChVector<double> *)&local_b78);
  local_df8.coord_dtdt.pos.m_data[0] = 7.0;
  local_df8.coord_dtdt.pos.m_data[1] = 8.0;
  local_b78.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x4011333333333333;
  local_b78.super_ChFrame<double>.coord.pos.m_data[0] = 5.3;
  local_df8.coord_dtdt.pos.m_data[2] = 9.0;
  local_b78.super_ChFrame<double>.coord.pos.m_data[1] = 2.3;
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_df8,(ChVector<double> *)&local_b78);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_df8);
  chrono::ChStreamOutAscii::operator<<(pCVar31,"a moving frame");
  local_6b8.m_data[0] = 0.1;
  local_6b8.m_data[1] = 3.1;
  local_6b8.m_data[2] = 1.1;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_b78,&local_6b8,(ChQuaternion<double> *)&chrono::QUNIT);
  local_b78.coord_dt.pos.m_data[0] = 3.2;
  local_b78.coord_dt.pos.m_data[1] = 9.2;
  local_b78.coord_dt.pos.m_data[2] = 7.2;
  local_678.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3fd999999999999a;
  local_678.super_ChFrame<double>.coord.pos.m_data[0] = 0.5;
  local_b78.coord_dt.rot.m_data[0] = local_e38.m_data[0];
  local_b78.coord_dt.rot.m_data[1] = local_e38.m_data[1];
  local_b78.coord_dt.rot.m_data[2] = local_e38.m_data[2];
  local_b78.coord_dt.rot.m_data[3] = local_e38.m_data[3];
  local_678.super_ChFrame<double>.coord.pos.m_data[1] = 0.6;
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_b78,(ChVector<double> *)&local_678);
  local_b78.coord_dtdt.pos.m_data[0] = 5.3;
  local_b78.coord_dtdt.pos.m_data[1] = 3.3;
  local_678.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3fdb851eb851eb85;
  local_678.super_ChFrame<double>.coord.pos.m_data[0] = 0.53;
  local_b78.coord_dtdt.pos.m_data[2] = 2.3;
  local_678.super_ChFrame<double>.coord.pos.m_data[1] = 0.63;
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_b78,(ChVector<double> *)&local_678);
  local_498.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_318.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_498.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_318.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_318.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_498.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_498.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_678,(ChVector<double> *)&local_318,(ChQuaternion<double> *)&local_498);
  local_318.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_f78.m_total.__r = 0.0;
  local_318.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_f78.m_start.__d.__r = (duration)0;
  local_f78.m_end.__d.__r = (duration)0;
  local_318.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_318.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_498,(ChVector<double> *)&local_f78,(ChQuaternion<double> *)&local_318);
  chrono::ChFrameMoving<double>::TransformLocalToParent(&local_df8,&local_b78,&local_678);
  chrono::ChFrameMoving<double>::operator>>(&local_318,&local_b78,&local_df8);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = chrono::operator<<(pCVar31,&local_318);
  chrono::ChStreamOutAscii::operator<<(pCVar31," trasf loc->abs \n");
  local_f78.m_start.__d.__r = (duration)0;
  local_f78.m_end.__d.__r = (duration)0;
  local_f78.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  iVar32 = 1000000;
  while (bVar33 = iVar32 != 0, iVar32 = iVar32 + -1, bVar33) {
    chrono::ChFrameMoving<double>::TransformLocalToParent(&local_df8,&local_b78,&local_678);
  }
  chrono::ChTimer<double>::stop(&local_f78);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = (ChStreamOutAscii *)
            chrono::ChStreamOutAscii::operator<<
                      (pCVar31,"TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: ");
  pCVar31 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar31,local_f78.m_total.__r);
  chrono::ChStreamOutAscii::operator<<(pCVar31," \n");
  local_f78.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  iVar32 = 1000000;
  while (bVar33 = iVar32 != 0, iVar32 = iVar32 + -1, bVar33) {
    chrono::ChFrame<double>::TransformLocalToParent(&local_e18,&local_740,&local_fd8);
    local_fb8.m_data[0] = local_e18.m_data[0];
    local_fb8.m_data[1] = local_e18.m_data[1];
    local_fb8.m_data[2] = local_e18.m_data[2];
  }
  chrono::ChTimer<double>::stop(&local_f78);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = (ChStreamOutAscii *)
            chrono::ChStreamOutAscii::operator<<
                      (pCVar31,"TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)");
  pCVar31 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar31,local_f78.m_total.__r);
  chrono::ChStreamOutAscii::operator<<(pCVar31," \n");
  local_f78.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  iVar32 = 1000000;
  while (bVar33 = iVar32 != 0, iVar32 = iVar32 + -1, bVar33) {
    chrono::ChFrameMoving<double>::PointAccelerationParentToLocal
              (&local_e18,&local_df8,&local_f98,&local_f98,&local_f98);
  }
  chrono::ChTimer<double>::stop(&local_f78);
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar31 = (ChStreamOutAscii *)
            chrono::ChStreamOutAscii::operator<<
                      (pCVar31,"TEST 10e6 of PointAccelerationParentToLocal (0.811)");
  pCVar31 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar31,local_f78.m_total.__r);
  chrono::ChStreamOutAscii::operator<<(pCVar31," \n");
  pCVar31 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar31,"\n  CHRONO execution terminated.");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    // To write something to the console, use the chrono::GetLog()
    GetLog() << "CHRONO demo about coordinate transformations: \n\n";

    //
    // Some methods to achieve coordinate transformations, and some
    // examples of how to manipulate coordinates and frames, using Chrono features.
    //
    // You can use ChTransform or ChChCoordsys<> or ChFrame functions to transform points
    // from/to local coordinates in 3D, in ascending complexity and capabilities.
    //

    ChVector<> mvect2;  // resulting (transformed) vectors will go here
    ChVector<> mvect3;

    // Define a  POINT  to be transformed, expressed in
    // local frame coordinate.
    ChVector<> mvect1(2, 3, 4);

    // Define a vector representing the TRANSLATION of the frame
    // respect to absolute (world) coordinates.
    ChVector<> vtraslA(5, 6, 7);

    // Define a quaternion representing the ROTATION of the frame
    // respect to absolute (world) coordinates. Must be normalized.
    ChQuaternion<> qrotA(1, 3, 4, 5);
    qrotA.Normalize();

    // ..Also create a 3x3 rotation matrix [A] from the quaternion
    // (at any time you can use mrotA.Set_A_quaternion(qrotA) );
    ChMatrix33<> mrotA(qrotA);

    // ..Also create a ChCoordsys<>tem object, representing both
    // translation and rotation.
    ChCoordsys<> csysA(vtraslA, qrotA);

    // OK!!! Now we are ready to perform the transformation, like in
    // linear algebra formula v'=t+[A]*v, so that we will obtain
    // the coordinates of mvect1 in absolute coordinates.
    // This can be achieved in many ways. Let's see them.

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //
    mvect2 = vtraslA + mrotA * mvect1;  // like:  v2 = t + [A]*v1
    GetLog() << mvect2 << " ..using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect2 = vtraslA + qrotA.Rotate(mvect1);
    GetLog() << mvect2 << " ..using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, mrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and rot.matrix, \n";

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, qrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect2 = csysA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChChCoordsys<> object, \n";

    mvect2 = mvect1 >> csysA;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '>>' operator, \n";

    mvect2 = csysA * mvect1;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '*' operator, \n";

    // TRANSFORM USING A ChFrame OBJECT

    ChFrame<> mframeA(vtraslA, qrotA);  // or ChFrame<> mframeA(csysA);

    mvect2 = mframeA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChFrame object function, \n";

    mvect2 = mvect1 >> mframeA;
    GetLog() << mvect2 << " ..using a ChFrame '>>' operator, \n";

    mvect2 = mframeA * mvect1;
    GetLog() << mvect2 << " ..using a ChFrame '*' operator, \n";

    //
    // Now perform transformations in a chain of frames, in
    // sequence.
    //

    ChVector<> v10(5, 6, 7);
    ChQuaternion<> q10(1, 3, 4, 5);
    q10.Normalize();
    ChMatrix33<> m10(q10);

    ChVector<> v21(4, 1, 3);
    ChQuaternion<> q21(3, 2, 1, 5);
    q21.Normalize();
    ChMatrix33<> m21(q21);

    ChVector<> v32(1, 5, 1);
    ChQuaternion<> q32(4, 1, 3, 1);
    q32.Normalize();
    ChMatrix33<> m32(q32);

    // ...with linear algebra:

    mvect3 = v10 + m10 * (v21 + m21 * (v32 + m32 * mvect1));
    GetLog() << mvect3 << " ..triple trsf. using linear algebra, \n";

    // ...with ChFrame '>>' operator or "*" operator
    // is by far much simplier!

    ChFrame<> f10(v10, q10);
    ChFrame<> f21(v21, q21);
    ChFrame<> f32(v32, q32);

    mvect3 = mvect1 >> f32 >> f21 >> f10;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '>>' operator, \n";

    mvect3 = f10 * f21 * f32 * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    ChFrame<> tempf(f10 * f21 * f32);
    mvect3 = tempf * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    // Not only vectors, but also ChFrame can be transformed
    // with ">>" or "*" operators.

    ChFrame<> f_3(mvect1);
    ChFrame<> f_0;
    f_0 = f_3 >> f32 >> f21 >> f10;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '>>' operator,  \n";

    f_0 = f10 * f21 * f32 * f_3;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '*' operator,  \n";

    // Test the  ">>" or "*" operators also for ChCoordsys:
    ChCoordsys<> c_0;
    c_0 = f_3.GetCoord() >> f32.GetCoord() >> f21.GetCoord() >> f10.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '>>' operator,  \n";

    c_0 = f10.GetCoord() * f21.GetCoord() * f32.GetCoord() * f_3.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '*' operator,  \n";

    //
    // Now test inverse transformations too.
    //
    // From the low-level to the higher level methods, here are some
    // ways to accomplish this.
    //

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //

    GetLog() << mvect1 << " ..mvect1 \n";
    mvect1 = mrotA.transpose() * (mvect2 - vtraslA);  // like:  v1 = [A]'*(v2-t)
    GetLog() << mvect1 << " ..inv, using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect1 = qrotA.RotateBack(mvect2 - vtraslA);
    GetLog() << mvect1 << " ..inv, using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, mrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and rot.matrix, \n";

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, qrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect1 = csysA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChChCoordsys<> object, \n";

    // TRANSFORM USING A ChFrame OBJECT

    mvect1 = mframeA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChFrame object function, \n";

    mvect1 = mvect2 >> mframeA.GetInverse();
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and '>>' operator, \n";

    mvect1 = mframeA.GetInverse() * mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and  '*' operator, \n";

    mvect1 = mframeA / mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame '/' operator, \n";

    ChFrame<> mframeAinv(mframeA);
    mframeAinv.Invert();
    mvect1 = mframeAinv * mvect2;
    GetLog() << mvect1 << " ..inv, using an inverted ChFrame \n";

    // ... also for inverting chain of transformations...

    // mvect3 =  f10 * f21 * f32 * mvect1;				// direct transf..

    mvect1 = (f10 * f21 * f32).GetInverse() * mvect3;  // inverse transf.
    GetLog() << mvect1 << " ..inv three transf \n";

    mvect1 = f32.GetInverse() * f21.GetInverse() * f10.GetInverse() * mvect3;
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> (f32 >> f21 >> f10).GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> f10.GetInverse() >> f21.GetInverse() >> f32.GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    //
    // Now test the * and >> operators with some mixed-types operators
    //

    ChFrame<> mframeA1(vtraslA, qrotA);
    ChFrameMoving<> mframemovingB1(vtraslA, qrotA);
    ChFrame<> mresf = mframemovingB1 * mframeA1;
    ChFrameMoving<> mresg = mframeA1 * mframemovingB1;

    //
    // Test some in-place operators, even with mixed-types. Some examples.
    //

    // Transform mframeA1 by rotating & translating by another frame,
    // using the in-place >>= operator, as in  A >>= B,
    // that means:   frameA' = frameA >> frameB  = frameB * frameA
    mframeA1 >>= f10;

    // Transform mframeA1 by translating by a vector:
    mframeA1 >>= ChVector<>(1, 2, 3);

    // Transform mframeA1 by rotating it 30 degrees on axis Y, using a quaternion:
    mframeA1 >>= Q_from_AngAxis(30 * CH_C_DEG_TO_RAD, VECT_Y);

    //
    // BENCHMARK FOR EXECUTION SPEED
    //

    GetLog() << " %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n";

    mrotA.Set_A_quaternion(qrotA);
    ChFpMatrix34<> Fp(qrotA);
    ChFmMatrix34<> Fm(qrotA);
    ChGlMatrix34<> Gl(qrotA);
    ChGwMatrix34<> Gw(qrotA);

    ChFrameMoving<> testa(vtraslA, qrotA);
    testa.SetPos_dt(ChVector<>(0.5, 0.6, 0.7));
    testa.SetWvel_loc(ChVector<>(1.1, 2.1, 5.1));
    testa.SetPos_dtdt(ChVector<>(7, 8, 9));
    testa.SetWacc_loc(ChVector<>(4.3, 5.3, 2.3));
    GetLog() << testa << "a moving frame";

    ChVector<> locpos(0.1, 3.1, 1.1);
    ChVector<> locspeed(3.2, 9.2, 7.2);
    ChVector<> locacc(5.3, 3.3, 2.3);

    ChFrameMoving<> testPl(locpos, QUNIT);
    testPl.SetPos_dt(locspeed);
    testPl.SetRot_dt(qrotA);
    testPl.SetWvel_loc(ChVector<>(0.4, 0.5, 0.6));
    testPl.SetPos_dtdt(locacc);
    testPl.SetWacc_loc(ChVector<>(0.43, 0.53, 0.63));
    ChFrameMoving<> testPw;
    ChFrameMoving<> testX;
    testa.TransformLocalToParent(testPl, testPw);

    ChFrameMoving<> bres = (testPl >> testa);

    GetLog() << bres << " trasf loc->abs \n";

    ChQuaternion<> pollo(3, 5, 6, 7);
    ChVector<> pallo(2, 4, 6);

    ChTimer<double> timer;

    //int numcycles = 100000;
    int i;

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.TransformLocalToParent(testPl, testPw);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: " << timer() << " \n";
    // VC6   : 1.380
    // VC2003: 0.861
    // VC2005: 0.691
    // GCC   : 0.661

    timer.start();
    for (i = 0; i < 1000000; i++) {
        mvect2 = mvect1 >> mframeA;
    }
    timer.stop();
    GetLog() << "TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)" << timer() << " \n";
    // VC6   : 0.03
    // VC2003: 0.03
    // VC2005: 0.03
    // GCC   : 0.03

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.PointAccelerationParentToLocal(vtraslA, vtraslA, vtraslA);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of PointAccelerationParentToLocal (0.811)" << timer() << " \n";
    // VC6   : 0.811
    // VC2003: 0.531
    // VC2005: 0.410
    // GCC   : 0.320

    /*
       timer.start();
       for (i= 0; i<numcycles; i++)
       {
           for (int j = 0; j<100; j++)
           {
               mvect2 = mvect1 >> f32 >> f21 >> f10;
               // NOTE: thank to the fact that operators are executed from left to
               // right, the above is MUCH faster (16x) than the equivalent:
               //    mvect2 =  f10 * f21 * f32 * mvect1;
               // because the latter, if no parenthesis are used, would imply
               // three expensive frame*frame operations, and a last frame*vector.
           }
       }
       timer.stop();
       GetLog() << "Test 3 frame transf. with >> ChFrame operator: " <<  timer() << " \n";


       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetCoord(vtraslA,qrotA);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetPos() " <<  timer() << " \n";


   //ChQuaternion<> mqdt(1, 2, 3, 4);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dt(mqdt);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetRot_dt() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dtdt(mqdt);
       }
       timer.stop()
       GetLog() << "Test ChFrame::SetRot_dtdt() " <<  timer() << " \n";


   ChVector<> mv(1, 2, 3);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWvel_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWacc_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWacc_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           Vector p= testa.GetWvel_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           ChVector<> p= testa.GetWacc_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWacc_loc() " <<  timer() << " \n";


   */

    GetLog() << "\n  CHRONO execution terminated.";

    return 0;
}